

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall t_xml_generator::generate_constant(t_xml_generator *this,t_const *con)

{
  allocator local_71;
  string local_70;
  string local_50;
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,"const",&local_71);
  write_element_start(this,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string((string *)&local_50,"name",&local_71);
  std::__cxx11::string::string((string *)&local_70,(string *)&con->name_);
  write_attribute(this,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  write_doc(this,&con->super_t_doc);
  write_type(this,con->type_);
  write_const_value(this,con->value_);
  write_element_end(this);
  return;
}

Assistant:

void t_xml_generator::generate_constant(t_const* con) {
  write_element_start("const");
  write_attribute("name", con->get_name());
  write_doc(con);
  write_type(con->get_type());
  write_const_value(con->get_value());
  write_element_end();
}